

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::JsonUnitTestResultPrinter::TestPropertiesAsJson
                   (string *__return_storage_ptr__,TestResult *result,string *indent)

{
  int iVar1;
  int iVar2;
  Message *pMVar3;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  allocator<char> *in_stack_ffffffffffffff00;
  allocator<char> local_91;
  string local_90;
  string local_70;
  char *local_50;
  TestProperty *local_38;
  TestProperty *property;
  int i;
  Message attributes;
  string *indent_local;
  TestResult *result_local;
  
  attributes.ss_.ptr_ =
       (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )indent;
  Message::Message((Message *)&stack0xffffffffffffffd8);
  property._4_4_ = 0;
  while( true ) {
    iVar1 = property._4_4_;
    iVar2 = TestResult::test_property_count(result);
    if (iVar2 <= iVar1) break;
    local_38 = TestResult::GetTestProperty(result,property._4_4_);
    Message::operator<<((Message *)in_stack_ffffffffffffff00,(char (*) [3])in_stack_fffffffffffffef8
                       );
    pMVar3 = Message::operator<<((Message *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    Message::operator<<(pMVar3,(char (*) [2])0x8974b0);
    local_50 = TestProperty::key(local_38);
    pMVar3 = Message::operator<<((Message *)in_stack_ffffffffffffff00,
                                 (char **)in_stack_fffffffffffffef8);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [4])"\": ");
    Message::operator<<(pMVar3,(char (*) [2])0x8974b0);
    __s = TestProperty::value(local_38);
    in_stack_ffffffffffffff00 = &local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,__s,in_stack_ffffffffffffff00);
    EscapeJson(&local_70,&local_90);
    in_stack_fffffffffffffef8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Message::operator<<((Message *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    Message::operator<<((Message *)in_stack_fffffffffffffef8,(char (*) [2])0x8974b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    property._4_4_ = property._4_4_ + 1;
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&stack0xffffffffffffffd8);
  Message::~Message((Message *)0x779f3a);
  return __return_storage_ptr__;
}

Assistant:

std::string JsonUnitTestResultPrinter::TestPropertiesAsJson(
    const TestResult& result, const std::string& indent) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << ",\n" << indent << "\"" << property.key() << "\": "
               << "\"" << EscapeJson(property.value()) << "\"";
  }
  return attributes.GetString();
}